

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void Fossilize::StreamArchive::convert_to_le(uint8_t *le_output,uint32_t *value_input,uint count)

{
  uint32_t uVar1;
  undefined1 *puVar2;
  uint local_20;
  uint32_t v;
  uint i;
  uint count_local;
  uint32_t *value_input_local;
  uint8_t *le_output_local;
  
  value_input_local = (uint32_t *)le_output;
  for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
    uVar1 = value_input[local_20];
    *(char *)value_input_local = (char)uVar1;
    *(char *)((long)value_input_local + 1) = (char)(uVar1 >> 8);
    puVar2 = (undefined1 *)((long)value_input_local + 3);
    *(char *)((long)value_input_local + 2) = (char)(uVar1 >> 0x10);
    value_input_local = value_input_local + 1;
    *puVar2 = (char)(uVar1 >> 0x18);
  }
  return;
}

Assistant:

static void convert_to_le(uint8_t *le_output, const uint32_t *value_input, unsigned count)
	{
		for (unsigned i = 0; i < count; i++)
		{
			uint32_t v = value_input[i];
			*le_output++ = uint8_t((v >> 0) & 0xffu);
			*le_output++ = uint8_t((v >> 8) & 0xffu);
			*le_output++ = uint8_t((v >> 16) & 0xffu);
			*le_output++ = uint8_t((v >> 24) & 0xffu);
		}
	}